

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogTailIdx.cpp
# Opt level: O0

list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall liblogger::LogTailIdx::GetList_abi_cxx11_(LogTailIdx *this,uint64_t *idx,int maxitems)

{
  iterator this_00;
  pointer ppVar1;
  int in_ECX;
  ulong *in_RDX;
  long in_RSI;
  value_type *in_RDI;
  uint64_t i;
  int count;
  iterator it;
  LogManagerScopedLock lock;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *lst;
  map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_ffffffffffffff88;
  LogManagerScopedLock *in_stack_ffffffffffffff90;
  ulong uVar2;
  value_type *this_01;
  ulong local_40;
  undefined4 in_stack_ffffffffffffffc8;
  int iVar3;
  
  this_01 = in_RDI;
  LogManagerScopedLock::LogManagerScopedLock(in_stack_ffffffffffffff90);
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::list((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)0x1aa4a7);
  if (*(ulong *)(in_RSI + 0x10) < *in_RDX) {
    *in_RDX = *(ulong *)(in_RSI + 0x10);
  }
  else {
    this_00 = std::
              map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::begin(in_stack_ffffffffffffff88);
    uVar2 = *in_RDX;
    ppVar1 = std::
             _Rb_tree_iterator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator->((_Rb_tree_iterator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)0x1aa507);
    if (uVar2 < ppVar1->first) {
      ppVar1 = std::
               _Rb_tree_iterator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator->((_Rb_tree_iterator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)0x1aa51e);
      *in_RDX = ppVar1->first;
    }
    iVar3 = 0;
    for (local_40 = *in_RDX; local_40 < *(ulong *)(in_RSI + 0x10); local_40 = local_40 + 1) {
      if ((0 < in_ECX) && (in_ECX < iVar3)) {
        *in_RDX = local_40;
        LogManager::Unlock();
        goto LAB_001aa615;
      }
      std::
      map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator[]((map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)this_00._M_node,(key_type_conflict *)CONCAT44(iVar3,in_stack_ffffffffffffffc8)
                  );
      std::__cxx11::
      list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)this_01,in_RDI);
      iVar3 = iVar3 + 1;
    }
    *in_RDX = *(ulong *)(in_RSI + 0x10);
  }
LAB_001aa615:
  LogManagerScopedLock::~LogManagerScopedLock((LogManagerScopedLock *)0x1aa630);
  return (list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)in_RDI;
}

Assistant:

std::list<std::string> LogTailIdx::GetList(uint64_t *idx, int maxitems) {
	LogManagerScopedLock lock = LogManagerScopedLock();
	std::list<std::string> lst;

	if (*idx > m_current)
	{
		*idx = m_current;
		return lst;
	}

	//skip idx to first item in case it has not been used in a while
	std::map<uint64_t, std::string>::iterator it = m_data.begin();
	if (*idx < it->first)
	{
		*idx = it->first;
	}

	int count = 0;
	for(uint64_t i=*idx;i<m_current;i++)
	{
		if (maxitems > 0 && count > maxitems)
		{
			*idx = i;
			LogManager::Unlock();
			return lst;
		}
		lst.push_back(m_data[i]);
		count++;
	}
	*idx = m_current;
	return lst;
}